

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

float_specs
duckdb_fmt::v6::internal::parse_float_type_spec<duckdb_fmt::v6::internal::error_handler,wchar_t>
          (basic_format_specs<wchar_t> *specs,error_handler *eh)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  ulong uVar4;
  
  uVar6 = (uint)(byte)specs->thousands * 0x10000;
  bVar2 = (byte)specs->field_0x9 >> 7;
  uVar5 = (uint)bVar2 * 0x20000000;
  uVar3 = uVar5 + uVar6;
  uVar4 = (ulong)uVar3;
  cVar1 = specs->type;
  switch(cVar1) {
  case 'a':
switchD_01b07db9_caseD_61:
    uVar4 = (ulong)(uVar3 | 3);
    break;
  case 'b':
  case 'c':
  case 'd':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'm':
switchD_01b07da1_caseD_42:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
    std::operator+(&local_48,"Invalid type specifier \"",&local_68);
    __return_storage_ptr__ = &local_28;
    std::operator+(__return_storage_ptr__,&local_48,"\" for formatting a value of type float");
    error_handler::on_error((error_handler *)__return_storage_ptr__,&local_28);
  case 'e':
switchD_01b07db9_caseD_65:
    uVar6 = 0x20000000;
    if (specs->precision == 0) {
      uVar6 = uVar5;
    }
    uVar4 = (ulong)(uVar3 & 0x1ffffffe | uVar6 | 1);
    break;
  case 'f':
switchD_01b07db9_caseD_66:
    uVar6 = 0x20000000;
    if (specs->precision == 0) {
      uVar6 = uVar5;
    }
    uVar4 = (ulong)(uVar3 & 0x1ffffffd | uVar6 | 2);
  case 'g':
    break;
  case 'l':
  case 'n':
switchD_01b07da1_caseD_4c:
    uVar4 = (ulong)(uVar3 | 0x2000000);
    break;
  default:
    switch(cVar1) {
    case 'A':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_01b07db9_caseD_61;
    case 'B':
    case 'C':
    case 'D':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
      goto switchD_01b07da1_caseD_42;
    case 'E':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_01b07db9_caseD_65;
    case 'F':
      uVar3 = uVar3 | 0x1000000;
      goto switchD_01b07db9_caseD_66;
    case 'G':
      uVar4 = (ulong)(uVar3 | 0x1000000);
      break;
    case 'L':
      goto switchD_01b07da1_caseD_4c;
    default:
      if (cVar1 != '\0') goto switchD_01b07da1_caseD_42;
      uVar4 = (ulong)((uint)(specs->precision != 0 | bVar2) << 0x1d | uVar6);
    }
  }
  return (float_specs)(uVar4 << 0x20);
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {

  auto result = float_specs();
  result.thousand_sep = specs.thousands;
  result.trailing_zeros = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.trailing_zeros |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.trailing_zeros |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
  case 'l':
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("Invalid type specifier \"" + std::string(1, specs.type) + "\" for formatting a value of type float");
    break;
  }
  return result;
}